

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_stroke_arc(nk_command_buffer *b,float cx,float cy,float radius,float a_min,float a_max,
                  float line_thickness,nk_color c)

{
  void *pvVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined4 in_XMM5_Db;
  undefined4 in_XMM5_Dc;
  undefined4 in_XMM5_Dd;
  
  if (((0.0 < line_thickness) && (b != (nk_command_buffer *)0x0)) && (0xffffff < (uint)c)) {
    pvVar1 = nk_command_buffer_push(b,NK_COMMAND_ARC,0x28);
    auVar3._4_4_ = in_XMM5_Db;
    auVar3._0_4_ = line_thickness;
    auVar3._8_4_ = in_XMM5_Dc;
    auVar3._12_4_ = in_XMM5_Dd;
    if (pvVar1 != (void *)0x0) {
      auVar2._0_4_ = (int)cx;
      auVar2._4_4_ = (int)cy;
      auVar2._8_4_ = (int)radius;
      auVar2._12_4_ = (int)line_thickness;
      auVar4 = pshuflw(auVar3,auVar2,0xe8);
      auVar3 = pshufhw(auVar2,auVar2,0xe8);
      *(ulong *)((long)pvVar1 + 0x10) = CONCAT44(auVar3._8_4_,auVar4._0_4_);
      *(float *)((long)pvVar1 + 0x18) = a_min;
      *(float *)((long)pvVar1 + 0x1c) = a_max;
      *(short *)((long)pvVar1 + 0x20) = c._0_2_;
      *(nk_byte *)((long)pvVar1 + 0x22) = c.b;
      *(nk_byte *)((long)pvVar1 + 0x23) = c.a;
    }
  }
  return;
}

Assistant:

NK_API void
nk_stroke_arc(struct nk_command_buffer *b, float cx, float cy, float radius,
    float a_min, float a_max, float line_thickness, struct nk_color c)
{
    struct nk_command_arc *cmd;
    if (!b || c.a == 0 || line_thickness <= 0) return;
    cmd = (struct nk_command_arc*)
        nk_command_buffer_push(b, NK_COMMAND_ARC, sizeof(*cmd));
    if (!cmd) return;
    cmd->line_thickness = (unsigned short)line_thickness;
    cmd->cx = (short)cx;
    cmd->cy = (short)cy;
    cmd->r = (unsigned short)radius;
    cmd->a[0] = a_min;
    cmd->a[1] = a_max;
    cmd->color = c;
}